

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O1

void idx2::EncodeBrick(idx2_file *Idx2,params *P,encode_data *E,bool IncrementLevel)

{
  i64 *this;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  int iVar10;
  u64 uVar11;
  bool IncrementLevel_00;
  int iVar12;
  brick_volume *TransformDetails;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  grid *SbGrid;
  uint uVar19;
  long lVar20;
  char cVar21;
  uint uVar22;
  extent eVar23;
  v3i Brick3;
  extent ToGrid;
  u64 PKey;
  grid SbGridNonExt;
  iterator PbIt;
  iterator BIt;
  extent local_110;
  undefined1 local_100 [8];
  brick_volume local_f8;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_b8;
  v3<int> *local_b0;
  v3i *local_a8;
  int *local_a0;
  int *local_98;
  grid *local_90;
  array<idx2::subband> *local_88;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_80;
  volume *local_78;
  long local_70;
  long local_68;
  extent local_60;
  iterator local_50;
  
  cVar9 = (P->Meta).Field[0x2c] + (char)E;
  (P->Meta).Field[0x2c] = cVar9;
  if ('\x0f' < cVar9) {
    pcVar14 = 
    "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]";
LAB_0018d0f5:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,pcVar14);
  }
  lVar20 = (long)cVar9;
  this = &(P->NasaMask).Buffer.Bytes;
  local_f8.Vol.Buffer.Data =
       (byte *)(*(long *)((P->Meta).Field + lVar20 * 8 + 0x34) * 0x10 + lVar20);
  local_b8 = (anon_union_8_4_6ba14846_for_v2<int>_1)local_f8.Vol.Buffer.Data;
  Lookup<unsigned_long,idx2::brick_volume>
            (&local_50,(idx2 *)this,(hash_table<unsigned_long,_idx2::brick_volume> *)(local_100 + 8)
             ,(unsigned_long *)local_f8.Vol.Buffer.Data);
  uVar11 = ((local_50.Val)->ExtentLocal).Dims;
  local_f8.Vol.Buffer.Data =
       (byte *)((long)(uVar11 << 0x16) >> 0xb & 0xffffffff00000000U |
               (ulong)(uint)((long)(uVar11 << 0x2b) >> 0x2b));
  local_f8.Vol.Buffer.Bytes =
       CONCAT44(local_f8.Vol.Buffer.Bytes._4_4_,(int)((long)(uVar11 * 2) >> 0x2b));
  ExtrapolateCdf53((v3i *)(local_100 + 8),Idx2->TransformOrder,&(local_50.Val)->Vol);
  local_a8 = &Idx2->BrickDimsExt3;
  local_88 = &Idx2->Subbands;
  TransformDetails = (brick_volume *)&Idx2->TransformDetails;
  ForwardCdf53(local_a8,(int)(P->Meta).Field[0x2c],local_88,(transform_info *)TransformDetails,
               &(local_50.Val)->Vol,cVar9 + 1 == (int)Idx2->NLevels);
  if ((Idx2->Subbands).Size != 0) {
    local_98 = &P->BitPlanesPerFile + lVar20 * 3;
    cVar21 = (char)(cVar9 + 1);
    uVar13 = (ulong)cVar21;
    local_a0 = &P->BitPlanesPerFile + uVar13 * 3;
    local_b0 = (Idx2->NBricks3).Arr + lVar20;
    lVar20 = 0;
    cVar9 = '\0';
    do {
      pbVar6 = (local_88->Buffer).Data;
      SbGrid = (grid *)(pbVar6 + lVar20 * 0x40);
      lVar20 = *(long *)(pbVar6 + lVar20 * 0x40 + 8);
      iVar17 = (int)((lVar20 << 0x16) >> 0x2b);
      if ((cVar9 == '\0') && (cVar21 < Idx2->NLevels)) {
        local_90 = SbGrid;
        if ('\x0f' < cVar21) {
          pcVar14 = 
          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
          ;
          goto LAB_0018d0f5;
        }
        uVar22 = (int)((lVar20 << 0x2b) >> 0x2b) - (uint)(1 < (lVar20 << 0x2b) >> 0x2b);
        uVar18 = iVar17 - (uint)(1 < iVar17);
        iVar17 = *local_98;
        iVar1 = local_98[1];
        iVar2 = (int)((extent *)(local_98 + 2))->From;
        uVar19 = (int)(lVar20 * 2 >> 0x2b) - (uint)(1 < lVar20 * 2 >> 0x2b);
        uVar7 = (long)iVar17 / (long)(Idx2->GroupBrick3).field_0.field_0.X;
        uVar8 = (long)iVar2 / (long)(Idx2->GroupBrick3).field_0.field_0.Z;
        *(ulong *)local_a0 =
             (long)iVar1 / (long)(Idx2->GroupBrick3).field_0.field_0.Y << 0x20 | uVar7 & 0xffffffff;
        *(int *)&((extent *)(local_a0 + 2))->From = (int)uVar8;
        Brick3.field_0._0_8_ = uVar8 & 0xffffffff;
        Brick3.field_0.field_0.Z = iVar2;
        uVar11 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(uVar13 & 0xffffffff),(int)uVar7,Brick3);
        *(u64 *)((P->Meta).Field + uVar13 * 8 + 0x34) = uVar11;
        local_100 = (undefined1  [8])(uVar11 * 0x10 + uVar13);
        Lookup<unsigned_long,idx2::brick_volume>
                  ((iterator *)&local_80.field_0,(idx2 *)this,
                   (hash_table<unsigned_long,_idx2::brick_volume> *)local_100,(unsigned_long *)P);
        if (*(char *)(*(long *)(local_70 + 0x10) + local_68) != '\x02') {
          if (Mallocator()::Instance == '\0') {
            EncodeBrick();
          }
          local_f8.Vol.Buffer.Data = (byte *)0x0;
          local_f8.Vol.Buffer.Bytes = 0;
          local_f8.Vol.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
          local_f8.Vol.Dims = 0;
          local_f8.Vol.Type = 10;
          local_f8.ExtentLocal.From = 0;
          local_f8.ExtentLocal.Dims = 0;
          local_f8.NChildrenDecoded = '\0';
          local_f8.NChildrenMax = '\0';
          local_f8.Significant = false;
          local_f8.DoneDecoding = false;
          Resize((volume *)(local_100 + 8),local_a8,float64,(allocator *)(P->NasaMask).Buffer.Data);
          lVar16 = (long)(local_f8.Vol.Dims * 2) >> 0x2b;
          lVar20 = (long)(local_f8.Vol.Dims << 0x16) >> 0x2b;
          if (lVar20 != 0 && (lVar16 != 0 && (local_f8.Vol.Dims & 0x1fffff) != 0)) {
            memset(local_f8.Vol.Buffer.Data,0,
                   lVar16 * lVar20 * ((long)(local_f8.Vol.Dims << 0x2b) >> 0x2b) * 8);
          }
          uVar3 = (Idx2->GroupBrick3).field_0.field_0.X;
          uVar4 = (Idx2->GroupBrick3).field_0.field_0.Y;
          uVar5 = (Idx2->GroupBrick3).field_0.field_0.Z;
          local_110.From =
               (ulong)(iVar2 - iVar2 % (int)uVar5 & 0x1fffff) << 0x2a |
               (ulong)(iVar1 - iVar1 % (int)uVar4 & 0x1fffff) << 0x15 |
               (ulong)(iVar17 - iVar17 % (int)uVar3 & 0x1fffff);
          local_110.Dims =
               (ulong)(uVar5 & 0x1fffff) << 0x2a |
               ((ulong)uVar4 & 0x1fffff) << 0x15 | (ulong)uVar3 & 0x1fffff;
          local_60.From = 0;
          local_60.Dims =
               (ulong)((local_b0->field_0).field_0.Z & 0x1fffff) << 0x2a |
               ((ulong)(uint)(local_b0->field_0).field_0.Y & 0x1fffff) << 0x15 |
               (ulong)(uint)(local_b0->field_0).field_0.X & 0x1fffff;
          eVar23 = Crop<idx2::extent,idx2::extent>(&local_110,&local_60);
          iVar15 = ((int)eVar23.Dims << 0xb) >> 0xb;
          iVar12 = (int)((long)(eVar23.Dims * 2) >> 0x2b);
          iVar10 = (int)((long)(eVar23.Dims << 0x16) >> 0x2b);
          local_f8.NChildrenMax = (char)iVar12 * (char)iVar15 * (char)iVar10;
          local_f8.ExtentLocal.Dims =
               (ulong)(uVar19 * iVar12 & 0x1fffff) << 0x2a |
               (ulong)(iVar10 * uVar18 & 0x1fffff) << 0x15 | (ulong)(iVar15 * uVar22 & 0x1fffff);
          local_f8.ExtentLocal.From = 0;
          Insert<unsigned_long,idx2::brick_volume>
                    ((iterator *)&local_80.field_0,(unsigned_long *)local_100,
                     (brick_volume *)(local_100 + 8));
        }
        SbGrid = local_90;
        local_f8.Vol.Buffer.Data = (byte *)(local_90->super_extent).From;
        local_f8.Vol.Buffer.Alloc = (allocator *)local_90->Strd;
        local_110.Dims =
             (ulong)(uVar19 & 0x1fffff) << 0x2a |
             (ulong)(uVar18 & 0x1fffff) << 0x15 | (ulong)(uVar22 & 0x1fffff);
        local_110.From =
             (ulong)((iVar2 % (Idx2->GroupBrick3).field_0.field_0.Z) * uVar19 & 0x1fffff) << 0x2a |
             (ulong)((iVar1 % (Idx2->GroupBrick3).field_0.field_0.Y) * uVar18 & 0x1fffff) << 0x15 |
             (ulong)((iVar17 % (Idx2->GroupBrick3).field_0.field_0.X) * uVar22 & 0x1fffff);
        local_f8.Vol.Buffer.Bytes = local_110.Dims;
        CopyGridExtent<double,double>
                  ((grid *)(local_100 + 8),&(local_50.Val)->Vol,&local_110,local_78);
        IncrementLevel_00 = (bool)(*(char *)&local_78[1].Buffer.Alloc + '\x01');
        *(bool *)&local_78[1].Buffer.Alloc = IncrementLevel_00;
        if (IncrementLevel_00 == (bool)*(undefined1 *)((long)&local_78[1].Buffer.Alloc + 1)) {
          EncodeBrick(Idx2,P,(encode_data *)0x1,IncrementLevel_00);
        }
      }
      (P->Meta).Field[0x2d] = cVar9;
      TransformDetails = local_50.Val;
      EncodeSubband(Idx2,(encode_data *)P,SbGrid,&(local_50.Val)->Vol);
      cVar9 = cVar9 + '\x01';
      lVar20 = (long)cVar9;
    } while ((Idx2->Subbands).Size != lVar20);
  }
  Dealloc(&(local_50.Val)->Vol);
  local_80 = local_b8;
  Delete<unsigned_long,idx2::brick_volume>
            ((iterator *)(local_100 + 8),(idx2 *)this,
             (hash_table<unsigned_long,_idx2::brick_volume> *)&local_80.field_0,
             (unsigned_long *)TransformDetails);
  pcVar14 = (P->Meta).Field + 0x2c;
  *pcVar14 = *pcVar14 - (char)E;
  return;
}

Assistant:

static void
EncodeBrick(idx2_file* Idx2, const params& P, encode_data* E, bool IncrementLevel = false)
{
  idx2_Assert(Idx2->NLevels <= idx2_file::MaxLevels);

  i8 Level = E->Level += IncrementLevel;

  u64 Brick = E->Brick[Level];
  //printf(
  //  "level %d brick " idx2_PrStrV3i " %" PRIu64 "\n", Iter, idx2_PrV3i(E->Bricks3[Iter]), Brick);
  auto BIt = Lookup(E->BrickPool, GetBrickKey(Level, Brick));
  idx2_Assert(BIt);
  volume& BVol = BIt.Val->Vol;
  idx2_Assert(BVol.Buffer);

  // TODO: we do not need to pre-extrapolate, instead just compute and store the extrapolated values
  ExtrapolateCdf53(Dims(BIt.Val->ExtentLocal), Idx2->TransformOrder, &BVol);

  /* do wavelet transform */
  bool CoarsestLevel = Level + 1 == Idx2->NLevels; // only normalize
  ForwardCdf53(Idx2->BrickDimsExt3, E->Level, Idx2->Subbands, Idx2->TransformDetails, &BVol, CoarsestLevel);

  /* recursively encode the brick, one subband at a time */
  idx2_For (i8, Sb, 0, Size(Idx2->Subbands))
  { // subband loop
    const subband& S = Idx2->Subbands[Sb];
    v3i SbDimsNonExt3 = idx2_NonExtDims(Dims(S.Grid));
    i8 NextLevel = Level + 1;
    if (Sb == 0 && NextLevel < Idx2->NLevels)
    { // need to encode the parent brick
      /* find the parent brick and create it if not found */
      v3i Brick3 = E->Bricks3[Level];
      v3i PBrick3 = (E->Bricks3[NextLevel] = Brick3 / Idx2->GroupBrick3);
      u64 PBrick = (E->Brick[NextLevel] = GetLinearBrick(*Idx2, NextLevel, PBrick3));
      u64 PKey = GetBrickKey(NextLevel, PBrick);
      auto PbIt = Lookup(E->BrickPool, PKey);
      if (!PbIt)
      { // instantiate the parent brick in the hash table
        brick_volume PBrickVol;
        Resize(&PBrickVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E->Alloc);
        Fill(idx2_Range(f64, PBrickVol.Vol), 0.0);
        v3i From3 = (Brick3 / Idx2->GroupBrick3) * Idx2->GroupBrick3;
        v3i NChildren3 =
          Dims(Crop(extent(From3, Idx2->GroupBrick3), extent(Idx2->NBricks3[Level])));
        PBrickVol.NChildrenMax = (i8)Prod(NChildren3);
        PBrickVol.ExtentLocal = extent(NChildren3 * SbDimsNonExt3);
        Insert(&PbIt, PKey, PBrickVol);
      }
      /* copy data to the parent brick and (optionally) encode it */
      v3i LocalBrickPos3 = Brick3 % Idx2->GroupBrick3;
      grid SbGridNonExt = S.Grid;
      SetDims(&SbGridNonExt, SbDimsNonExt3);
      extent ToGrid(LocalBrickPos3 * SbDimsNonExt3, SbDimsNonExt3);
      CopyGridExtent<f64, f64>(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      //      Copy(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      bool LastChild = ++PbIt.Val->NChildrenDecoded == PbIt.Val->NChildrenMax;
      if (LastChild)
        EncodeBrick(Idx2, P, E, true);
    } // end Sb == 0 && NextIteration < Idx2->NLevels
    E->Subband = Sb;
    EncodeSubband(Idx2, E, S.Grid, &BVol);
  } // end subband loop
  Dealloc(&BVol);
  Delete(&E->BrickPool, GetBrickKey(Level, Brick));
  E->Level -= IncrementLevel;
}